

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O0

int __thiscall ncnn::Bias::load_model(Bias *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  Mat *in_RDI;
  Mat *this_00;
  Mat local_60;
  int local_4;
  
  this_00 = &local_60;
  (**(code **)(*in_RSI + 0x10))(this_00,in_RSI,(int)in_RDI[2].cstep,1);
  Mat::operator=(this_00,in_RDI);
  Mat::~Mat((Mat *)0x178ec0);
  bVar1 = Mat::empty(in_RDI);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Bias::load_model(const ModelBin& mb)
{
    bias_data = mb.load(bias_data_size, 1);
    if (bias_data.empty())
        return -100;

    return 0;
}